

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::extract_global_variables_from_function
          (CompilerMSL *this,uint32_t func_id,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *added_arg_ids,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *global_var_ids,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *processed_func_ids)

{
  ushort uVar1;
  TypeID parameter_type;
  Decoration *pDVar2;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint32_t uVar7;
  StorageClass SVar8;
  ID IVar9;
  iterator iVar10;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *p_Var11;
  uint32_t *puVar12;
  _Node_iterator_base<unsigned_int,_false> _Var13;
  SPIRVariable *pSVar14;
  size_type sVar15;
  SPIRExtension *pSVar16;
  SPIRType *pSVar17;
  SPIRType *pSVar18;
  mapped_type *pmVar19;
  mapped_type *this_00;
  SPIRVariable *pSVar20;
  CompilerError *this_01;
  byte bVar21;
  TypedID<(spirv_cross::Types)6> *pTVar22;
  uint32_t arg_idx;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var23;
  ulong uVar24;
  ParsedIR *pPVar25;
  long lVar26;
  SPIRBlock *pSVar27;
  uint32_t mbr_idx;
  uint index;
  _Base_ptr p_Var28;
  bool bVar29;
  uint32_t rvalue_id;
  uint32_t type_id;
  SPIRVariable *local_f0;
  uint32_t ptr_type_id;
  SPIRType *local_e0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_d8;
  key_type local_cc;
  SPIRBlock *local_c8;
  _Base_ptr local_c0;
  uint32_t func_id_local;
  ParsedIR *local_b0;
  uint32_t base_id;
  undefined4 uStack_a4;
  ulong local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Base_ptr local_88;
  size_t local_80;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_78;
  SPIRType *local_70;
  SPIRFunction *local_68;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_60;
  uint32_t *local_58;
  key_type local_4c;
  SPIRType *local_48;
  SPIRType *local_40;
  AlignedBuffer<bool,_8UL> local_38;
  
  func_id_local = func_id;
  iVar10 = ::std::
           _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           ::find(&processed_func_ids->_M_h,&func_id_local);
  if (iVar10.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    local_78 = processed_func_ids;
    ::std::__detail::
    _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)processed_func_ids,&func_id_local);
    local_68 = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,func_id_local);
    pTVar22 = (local_68->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.ptr;
    local_60 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)(pTVar22 +
                  (local_68->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.
                  buffer_size);
    local_e0 = (SPIRType *)&this->builtin_helper_invocation_id;
    local_70 = (SPIRType *)&this->builtin_subgroup_invocation_id_id;
    local_b0 = (ParsedIR *)&this->builtin_subgroup_size_id;
    local_38.aligned_char = (char  [8])&this->atomic_image_vars_emulated;
    local_58 = &this->builtin_frag_coord_id;
    local_48 = (SPIRType *)&this->builtin_layer_id;
    local_40 = (SPIRType *)&this->builtin_view_idx_id;
    local_d8 = &global_var_ids->_M_h;
    while ((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            *)pTVar22 != local_60) {
      local_c0 = (_Base_ptr)pTVar22;
      local_c8 = Compiler::get<spirv_cross::SPIRBlock>((Compiler *)this,pTVar22->id);
      pSVar20 = (SPIRVariable *)(local_c8->ops).super_VectorView<spirv_cross::Instruction>.ptr;
      local_f0 = (SPIRVariable *)
                 ((pSVar20->dereference_chain).stack_storage.aligned_char +
                 (local_c8->ops).super_VectorView<spirv_cross::Instruction>.buffer_size * 0xc +
                 -0x38);
      for (; pSVar20 != local_f0; pSVar20 = (SPIRVariable *)&(pSVar20->super_IVariant).field_0xc) {
        puVar12 = Compiler::stream((Compiler *)this,(Instruction *)pSVar20);
        uVar1 = *(ushort *)&(pSVar20->super_IVariant)._vptr_IVariant;
        if (uVar1 - 0x1780 < 0x11) {
LAB_001a3888:
          uVar7 = puVar12[2];
LAB_001a38c9:
          base_id = uVar7;
          _Var13._M_cur =
               (__node_type *)
               ::std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find(&global_var_ids->_M_h,(key_type_conflict *)&base_id);
joined_r0x001a38de:
          pPVar25 = (ParsedIR *)&base_id;
          if (_Var13._M_cur != (__node_type *)0x0) {
LAB_001a38e8:
            ::std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)added_arg_ids,(uint *)pPVar25);
          }
        }
        else {
          if ((uVar1 - 0xe4 < 0xf) && (uVar1 - 0xe4 != 3)) {
LAB_001a3896:
            bVar4 = needs_frag_discard_checks(this);
            if (bVar4) {
              ::std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_unique<unsigned_int_const&>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)added_arg_ids,(uint *)local_e0);
            }
            _base_id = _base_id & 0xffffffff00000000;
            if ((uVar1 != 99) && (uVar1 != 0xe4)) {
              puVar12 = puVar12 + 2;
            }
LAB_001a38c7:
            uVar7 = *puVar12;
            goto LAB_001a38c9;
          }
          switch(uVar1) {
          case 0x39:
            for (uVar24 = 3; uVar24 < (pSVar20->super_IVariant).self.id; uVar24 = uVar24 + 1) {
              base_id = puVar12[uVar24];
              iVar10 = ::std::
                       _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::find(&global_var_ids->_M_h,(key_type_conflict *)&base_id);
              if (iVar10.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0
                 ) {
                ::std::
                _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                ::_M_insert_unique<unsigned_int_const&>
                          ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                            *)added_arg_ids,(uint *)&base_id);
              }
              global_var_ids =
                   (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)local_d8;
            }
            local_a0 = local_a0 & 0xffffffff00000000;
            local_98._M_allocated_capacity = 0;
            local_80 = 0;
            local_98._8_8_ = (_Base_ptr)&local_a0;
            local_88 = (_Base_ptr)&local_a0;
            extract_global_variables_from_function
                      (this,puVar12[2],
                       (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &base_id,global_var_ids,local_78);
            ::std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_range_unique<std::_Rb_tree_const_iterator<unsigned_int>>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)added_arg_ids,(_Rb_tree_const_iterator<unsigned_int>)local_98._8_8_,
                       (_Base_ptr)&local_a0);
            ::std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)&base_id);
            break;
          case 0x3a:
          case 0x3b:
          case 0x3f:
          case 0x40:
            break;
          case 0x3c:
            base_id = puVar12[2];
            pSVar14 = Compiler::maybe_get_backing_variable((Compiler *)this,puVar12[2]);
            if (pSVar14 == (SPIRVariable *)0x0) break;
            rvalue_id = (pSVar14->super_IVariant).self.id;
            sVar15 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)local_38.aligned_char,&rvalue_id);
            if ((sVar15 != 0) &&
               (pSVar18 = Compiler::get<spirv_cross::SPIRType>
                                    ((Compiler *)this,
                                     *(uint32_t *)&(pSVar14->super_IVariant).field_0xc),
               (pSVar18->array).super_VectorView<unsigned_int>.buffer_size != 0)) {
              this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (this_01,
                         "Cannot emulate array of storage images with atomics. Use MSL 3.1 for native support."
                        );
              __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
LAB_001a3c27:
            _Var13._M_cur =
                 (__node_type *)
                 ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(&global_var_ids->_M_h,(key_type_conflict *)&base_id);
            goto joined_r0x001a38de;
          case 0x3d:
          case 0x41:
          case 0x42:
          case 0x43:
          case 0x44:
            base_id = puVar12[2];
            iVar10 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find(&global_var_ids->_M_h,(key_type_conflict *)&base_id);
            if (iVar10.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0)
            {
              ::std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_unique<unsigned_int_const&>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)added_arg_ids,(uint *)&base_id);
            }
            pSVar18 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,*puVar12);
            global_var_ids =
                 (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)local_d8;
            if (((pSVar18->basetype == Image) && ((pSVar18->image).dim == DimSubpassData)) &&
               ((this->msl_options).use_framebuffer_fetch_subpasses == false)) {
              if (*local_58 == 0) {
                __assert_fail("builtin_frag_coord_id != 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                              ,0x750,
                              "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                             );
              }
              ::std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_unique<unsigned_int_const&>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)added_arg_ids,local_58);
              if ((this->msl_options).multiview == true) {
                pPVar25 = (ParsedIR *)local_40;
                if (*(int *)&local_40->super_IVariant == 0) {
                  __assert_fail("builtin_view_idx_id != 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                                ,0x755,
                                "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                               );
                }
              }
              else {
                if ((this->msl_options).arrayed_subpass_input != true) break;
                pPVar25 = (ParsedIR *)local_48;
                if (*(int *)&local_48->super_IVariant == 0) {
                  __assert_fail("builtin_layer_id != 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                                ,0x75b,
                                "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                               );
                }
              }
              goto LAB_001a38e8;
            }
            break;
          case 0x3e:
            base_id = *puVar12;
            iVar10 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find(&global_var_ids->_M_h,(key_type_conflict *)&base_id);
            if ((iVar10.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0)
               && ((::std::
                    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    ::_M_insert_unique<unsigned_int_const&>
                              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                *)added_arg_ids,(uint *)&base_id),
                   (this->msl_options).input_attachment_is_ds_attachment == true &&
                   (base_id == this->builtin_frag_depth_id)))) {
              this->writes_to_depth = true;
            }
            global_var_ids =
                 (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)local_d8;
            rvalue_id = puVar12[1];
            iVar10 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find(local_d8,&rvalue_id);
            if (iVar10.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0)
            {
              ::std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_unique<unsigned_int_const&>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)added_arg_ids,&rvalue_id);
            }
            bVar4 = needs_frag_discard_checks(this);
            pPVar25 = (ParsedIR *)local_e0;
            if (bVar4) goto LAB_001a38e8;
            break;
          default:
            if (uVar1 - 0x1179 < 5) goto LAB_001a38c7;
            pPVar25 = local_b0;
            if (1 < uVar1 - 0x157) {
              if (uVar1 == 0xc) {
                pSVar16 = Compiler::get<spirv_cross::SPIRExtension>((Compiler *)this,puVar12[2]);
                if (*(int *)&(pSVar16->super_IVariant).field_0xc == 1) {
                  uVar7 = puVar12[3];
                  if (uVar7 - 0x4c < 3) {
                    base_id = (this->stage_in_var_id).id;
                    ::std::
                    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::_M_insert_unique<unsigned_int>(&added_arg_ids->_M_t,(uint *)&base_id);
                  }
                  else if ((uVar7 == 0x23) || (uVar7 == 0x33)) {
                    uVar7 = puVar12[5];
                    goto LAB_001a38c9;
                  }
                }
                break;
              }
              if (uVar1 == 99) goto LAB_001a3896;
              if (uVar1 == 0xa9) {
                base_id = puVar12[3];
                iVar10 = ::std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find(&global_var_ids->_M_h,(key_type_conflict *)&base_id);
                if (iVar10.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                    (__node_type *)0x0) {
                  ::std::
                  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  ::_M_insert_unique<unsigned_int_const&>
                            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                              *)added_arg_ids,(uint *)&base_id);
                }
                base_id = puVar12[4];
                goto LAB_001a3c27;
              }
              pPVar25 = (ParsedIR *)local_70;
              if (uVar1 != 0x154) {
                if (uVar1 != 0x156) {
                  if (uVar1 == 0x117f) goto LAB_001a3888;
                  pPVar25 = (ParsedIR *)local_e0;
                  if (uVar1 == 0x1504) {
                    if ((((this->msl_options).manual_helper_invocation_updates == true) &&
                        (0x4f4b < (this->msl_options).msl_version)) &&
                       (this->needs_helper_invocation == true)) goto LAB_001a38e8;
                  }
                  else if (uVar1 == 0x1505) {
                    if (((this->msl_options).manual_helper_invocation_updates == true) &&
                       (0x4f4b < (this->msl_options).msl_version)) goto LAB_001a38e8;
                  }
                  else if (uVar1 == 0x1793) goto LAB_001a3896;
                  break;
                }
                if ((1 < puVar12[3] - 1) && (pPVar25 = local_b0, puVar12[3] != 0)) break;
              }
            }
            goto LAB_001a38e8;
          }
        }
        if ((((this->msl_options).manual_helper_invocation_updates == true) &&
            (0x4f4b < (this->msl_options).msl_version)) &&
           ((*(int *)&(local_c8->super_IVariant).field_0xc == 6 &&
            (this->needs_helper_invocation == true)))) {
          ::std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)added_arg_ids,(uint *)local_e0);
        }
      }
      pTVar22 = (TypedID<(spirv_cross::Types)6> *)((long)local_c0 + 4);
    }
    p_Var11 = &::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->function_global_vars,&func_id_local)->_M_t;
    ::std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::operator=(p_Var11,&added_arg_ids->_M_t);
    if (func_id_local != (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
      local_b0 = &(this->super_CompilerGLSL).super_Compiler.ir;
      local_c0 = (added_arg_ids->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      local_60 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_CompilerGLSL).super_Compiler.ir.meta;
      pSVar18 = (SPIRType *)0x0;
      p_Var23 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)0x0;
      pSVar27 = (SPIRBlock *)0x0;
      local_78 = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)0x0;
      while ((_Rb_tree_header *)local_c0 != &(added_arg_ids->_M_t)._M_impl.super__Rb_tree_header) {
        rvalue_id = local_c0[1]._M_color;
        local_d8 = p_Var23;
        local_f0 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,rvalue_id);
        type_id = *(uint32_t *)&(local_f0->super_IVariant).field_0xc;
        pSVar17 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type_id);
        uVar7 = Compiler::get_decoration((Compiler *)this,(ID)rvalue_id,DecorationBuiltIn);
        bVar4 = Compiler::has_decoration((Compiler *)this,(ID)rvalue_id,DecorationPatch);
        bVar5 = true;
        if (!bVar4) {
          bVar5 = is_patch_block(this,pSVar17);
        }
        bVar4 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(pSVar17->super_IVariant).self.id,DecorationBlock);
        local_e0 = pSVar18;
        if (bVar5 == false) {
          bVar4 = Compiler::is_tessellation_shader((Compiler *)this);
          if ((!bVar4) || (bVar4 = true, local_f0->storage != StorageClassInput)) {
            bVar4 = is_tesc_shader(this);
            goto LAB_001a3de9;
          }
        }
        else {
LAB_001a3de9:
          if (bVar4 == false) {
            bVar4 = false;
          }
          else {
            bVar4 = local_f0->storage == StorageClassOutput;
          }
        }
        local_c8 = pSVar27;
        bVar6 = Compiler::is_builtin_variable((Compiler *)this,local_f0);
        bVar29 = true;
        if ((bVar6) && ((4 < uVar7 || ((0x1bU >> (uVar7 & 0x1f) & 1) == 0)))) {
          bVar29 = pSVar17->basetype == Struct;
        }
        if (((bool)(bVar4 & bVar29)) && (local_f0->storage == StorageClassOutput)) {
          bVar4 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,local_f0);
          if (!bVar4) goto LAB_001a3e56;
LAB_001a3eae:
          if ((bVar6) &&
             (bVar4 = Compiler::has_decoration
                                ((Compiler *)this,(ID)(pSVar17->super_IVariant).self.id,
                                 DecorationBlock), bVar4)) {
            type_id = Compiler::get_pointee_type_id((Compiler *)this,type_id);
            pSVar17 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type_id);
            local_58 = &((pSVar17->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr)->id;
            uVar24 = 0;
            pSVar27 = local_c8;
            local_70 = pSVar17;
            for (lVar26 = (pSVar17->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
                          << 2; p_Var23 = local_d8, pSVar18 = local_e0, p_Var28 = local_c0,
                lVar26 != 0; lVar26 = lVar26 + -4) {
              base_id = 0x7fffffff;
              bVar4 = Compiler::is_member_builtin
                                ((Compiler *)this,pSVar17,(uint32_t)uVar24,&base_id);
              if (bVar4) {
                bVar4 = Compiler::has_active_builtin((Compiler *)this,base_id,local_f0->storage);
                if (bVar4) {
                  uVar7 = ParsedIR::increase_bound_by(local_b0,2);
                  puVar12 = local_58;
                  IVar9.id = uVar7 + 1;
                  ptr_type_id = uVar7;
                  pSVar18 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_58[uVar24]);
                  pSVar18 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                                      ((Compiler *)this,uVar7,pSVar18);
                  (pSVar18->super_IVariant).self.id = puVar12[uVar24];
                  pSVar18->storage = local_f0->storage;
                  pSVar18->pointer = true;
                  pSVar18->pointer_depth = pSVar18->pointer_depth + 1;
                  parameter_type.id = puVar12[uVar24];
                  (pSVar18->parent_type).id = parameter_type.id;
                  SPIRFunction::add_parameter(local_68,parameter_type,IVar9,true);
                  local_cc.id = 7;
                  Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                            ((Compiler *)this,IVar9.id,&ptr_type_id,&local_cc.id);
                  p_Var3 = local_60;
                  local_cc.id = type_id;
                  pmVar19 = ::std::__detail::
                            _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[](local_60,&local_cc);
                  pSVar17 = local_70;
                  pDVar2 = (pmVar19->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
                  local_4c.id = IVar9.id;
                  pmVar19 = ::std::__detail::
                            _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[](p_Var3,&local_4c);
                  pSVar27 = local_c8;
                  Meta::Decoration::operator=(&pmVar19->decoration,pDVar2 + (uVar24 & 0xffffffff));
                }
              }
              uVar24 = uVar24 + 1;
            }
          }
          else {
            IVar9.id = ParsedIR::increase_bound_by(local_b0,1);
            SPIRFunction::add_parameter(local_68,(TypeID)type_id,IVar9,true);
            base_id = 7;
            ptr_type_id = 0;
            Compiler::
            set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int,unsigned_int&>
                      ((Compiler *)this,IVar9.id,&type_id,(StorageClass *)&base_id,
                       (int *)&ptr_type_id,&rvalue_id);
            p_Var3 = local_60;
            base_id = rvalue_id;
            pmVar19 = ::std::__detail::
                      _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_60,(key_type *)&base_id);
            ptr_type_id = IVar9.id;
            this_00 = ::std::__detail::
                      _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](p_Var3,(key_type *)&ptr_type_id);
            Meta::operator=(this_00,pmVar19);
            p_Var23 = local_d8;
            pSVar18 = local_e0;
            pSVar27 = local_c8;
            p_Var28 = local_c0;
          }
        }
        else {
          if (!(bool)(bVar4 & bVar29)) goto LAB_001a3eae;
LAB_001a3e56:
          _base_id = (pointer)&local_98;
          local_a0 = 0;
          local_98._M_allocated_capacity = local_98._M_allocated_capacity & 0xffffffffffffff00;
          if (bVar5 == false) {
            ::std::__cxx11::string::assign((char *)&base_id);
          }
          else {
            ::std::__cxx11::string::_M_assign((string *)&base_id);
          }
          pSVar18 = local_e0;
          SVar8 = local_f0->storage;
          if (SVar8 == StorageClassOutput) {
            bVar4 = Compiler::has_decoration
                              ((Compiler *)this,(ID)(pSVar17->super_IVariant).self.id,
                               DecorationBlock);
            if (bVar4) {
              index = 0;
              do {
                if ((uint)(pSVar17->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
                    <= index) goto LAB_001a4183;
                bVar4 = CompilerGLSL::is_stage_output_block_member_masked
                                  (&this->super_CompilerGLSL,local_f0,index,true);
                index = index + 1;
              } while (!bVar4);
              SPIRFunction::add_parameter
                        (local_68,(TypeID)*(uint32_t *)&(local_f0->super_IVariant).field_0xc,
                         (ID)(local_f0->super_IVariant).self.id,true);
            }
LAB_001a4183:
            SVar8 = local_f0->storage;
          }
          p_Var23 = local_d8;
          p_Var28 = local_c0;
          if (SVar8 == StorageClassInput) {
            bVar21 = (byte)local_78;
            if (bVar5 != false) {
              bVar21 = (byte)local_d8;
            }
            if ((bVar21 & 1) == 0) {
              rvalue_id = this->next_metal_resource_ids[(ulong)(bVar5 ^ 1U) * 2 + 10];
              local_d8 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)CONCAT71((int7)((ulong)local_d8 >> 8),(byte)local_d8 | bVar5);
              local_78 = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)(ulong)(byte)(bVar5 ^ 1U | (byte)local_78);
              goto LAB_001a4246;
            }
          }
          else {
            if (SVar8 == StorageClassOutput) {
              bVar21 = (byte)local_c8;
              if (bVar5 != false) {
                bVar21 = (byte)pSVar18;
              }
              if ((bVar21 & 1) != 0) goto LAB_001a42ec;
              rvalue_id = this->next_metal_resource_ids[(ulong)(bVar5 ^ 1U) * 2 + 0xb];
              pSVar18 = (SPIRType *)CONCAT71((int7)((ulong)pSVar18 >> 8),(byte)pSVar18 | bVar5);
              local_c8 = (SPIRBlock *)(ulong)(byte)(bVar5 ^ 1U | (byte)local_c8);
            }
LAB_001a4246:
            pSVar20 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,rvalue_id);
            type_id = *(uint32_t *)&(pSVar20->super_IVariant).field_0xc;
            IVar9.id = ParsedIR::increase_bound_by(local_b0,1);
            p_Var28 = local_c0;
            p_Var23 = local_d8;
            SPIRFunction::add_parameter(local_68,(TypeID)type_id,IVar9,true);
            ptr_type_id = 7;
            local_cc.id = 0;
            Compiler::
            set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int,unsigned_int&>
                      ((Compiler *)this,IVar9.id,&type_id,&ptr_type_id,(int *)&local_cc,&rvalue_id);
            Compiler::set_name((Compiler *)this,IVar9,(string *)&base_id);
            bVar4 = is_tese_shader(this);
            if (((bVar4) && ((this->msl_options).raw_buffer_tese_input == true)) &&
               (local_f0->storage == StorageClassInput)) {
              Compiler::set_decoration((Compiler *)this,IVar9,DecorationNonWritable,0);
            }
          }
LAB_001a42ec:
          ::std::__cxx11::string::~string((string *)&base_id);
          pSVar27 = local_c8;
        }
        local_c0 = (_Base_ptr)::std::_Rb_tree_increment(p_Var28);
      }
    }
  }
  else {
    p_Var11 = &::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->function_global_vars,&func_id_local)->_M_t;
    ::std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::operator=(&added_arg_ids->_M_t,p_Var11);
  }
  return;
}

Assistant:

void CompilerMSL::extract_global_variables_from_function(uint32_t func_id, std::set<uint32_t> &added_arg_ids,
                                                         unordered_set<uint32_t> &global_var_ids,
                                                         unordered_set<uint32_t> &processed_func_ids)
{
	// Avoid processing a function more than once
	if (processed_func_ids.find(func_id) != processed_func_ids.end())
	{
		// Return function global variables
		added_arg_ids = function_global_vars[func_id];
		return;
	}

	processed_func_ids.insert(func_id);

	auto &func = get<SPIRFunction>(func_id);

	// Recursively establish global args added to functions on which we depend.
	for (auto block : func.blocks)
	{
		auto &b = get<SPIRBlock>(block);
		for (auto &i : b.ops)
		{
			auto ops = stream(i);
			auto op = static_cast<Op>(i.op);

			switch (op)
			{
			case OpLoad:
			case OpInBoundsAccessChain:
			case OpAccessChain:
			case OpPtrAccessChain:
			case OpArrayLength:
			{
				uint32_t base_id = ops[2];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);

				// Use Metal's native frame-buffer fetch API for subpass inputs.
				auto &type = get<SPIRType>(ops[0]);
				if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData &&
				    (!msl_options.use_framebuffer_fetch_subpasses))
				{
					// Implicitly reads gl_FragCoord.
					assert(builtin_frag_coord_id != 0);
					added_arg_ids.insert(builtin_frag_coord_id);
					if (msl_options.multiview)
					{
						// Implicitly reads gl_ViewIndex.
						assert(builtin_view_idx_id != 0);
						added_arg_ids.insert(builtin_view_idx_id);
					}
					else if (msl_options.arrayed_subpass_input)
					{
						// Implicitly reads gl_Layer.
						assert(builtin_layer_id != 0);
						added_arg_ids.insert(builtin_layer_id);
					}
				}

				break;
			}

			case OpFunctionCall:
			{
				// First see if any of the function call args are globals
				for (uint32_t arg_idx = 3; arg_idx < i.length; arg_idx++)
				{
					uint32_t arg_id = ops[arg_idx];
					if (global_var_ids.find(arg_id) != global_var_ids.end())
						added_arg_ids.insert(arg_id);
				}

				// Then recurse into the function itself to extract globals used internally in the function
				uint32_t inner_func_id = ops[2];
				std::set<uint32_t> inner_func_args;
				extract_global_variables_from_function(inner_func_id, inner_func_args, global_var_ids,
				                                       processed_func_ids);
				added_arg_ids.insert(inner_func_args.begin(), inner_func_args.end());
				break;
			}

			case OpStore:
			{
				uint32_t base_id = ops[0];
				if (global_var_ids.find(base_id) != global_var_ids.end())
				{
					added_arg_ids.insert(base_id);

					if (msl_options.input_attachment_is_ds_attachment && base_id == builtin_frag_depth_id)
						writes_to_depth = true;
				}

				uint32_t rvalue_id = ops[1];
				if (global_var_ids.find(rvalue_id) != global_var_ids.end())
					added_arg_ids.insert(rvalue_id);

				if (needs_frag_discard_checks())
					added_arg_ids.insert(builtin_helper_invocation_id);

				break;
			}

			case OpSelect:
			{
				uint32_t base_id = ops[3];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				base_id = ops[4];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				break;
			}

			case OpAtomicExchange:
			case OpAtomicCompareExchange:
			case OpAtomicStore:
			case OpAtomicIIncrement:
			case OpAtomicIDecrement:
			case OpAtomicIAdd:
			case OpAtomicFAddEXT:
			case OpAtomicISub:
			case OpAtomicSMin:
			case OpAtomicUMin:
			case OpAtomicSMax:
			case OpAtomicUMax:
			case OpAtomicAnd:
			case OpAtomicOr:
			case OpAtomicXor:
			case OpImageWrite:
			{
				if (needs_frag_discard_checks())
					added_arg_ids.insert(builtin_helper_invocation_id);
				uint32_t ptr = 0;
				if (op == OpAtomicStore || op == OpImageWrite)
					ptr = ops[0];
				else
					ptr = ops[2];
				if (global_var_ids.find(ptr) != global_var_ids.end())
					added_arg_ids.insert(ptr);
				break;
			}

			// Emulate texture2D atomic operations
			case OpImageTexelPointer:
			{
				// When using the pointer, we need to know which variable it is actually loaded from.
				uint32_t base_id = ops[2];
				auto *var = maybe_get_backing_variable(base_id);
				if (var)
				{
					if (atomic_image_vars_emulated.count(var->self) &&
					    !get<SPIRType>(var->basetype).array.empty())
					{
						SPIRV_CROSS_THROW(
								"Cannot emulate array of storage images with atomics. Use MSL 3.1 for native support.");
					}

					if (global_var_ids.find(base_id) != global_var_ids.end())
						added_arg_ids.insert(base_id);
				}
				break;
			}

			case OpExtInst:
			{
				uint32_t extension_set = ops[2];
				if (get<SPIRExtension>(extension_set).ext == SPIRExtension::GLSL)
				{
					auto op_450 = static_cast<GLSLstd450>(ops[3]);
					switch (op_450)
					{
					case GLSLstd450InterpolateAtCentroid:
					case GLSLstd450InterpolateAtSample:
					case GLSLstd450InterpolateAtOffset:
					{
						// For these, we really need the stage-in block. It is theoretically possible to pass the
						// interpolant object, but a) doing so would require us to create an entirely new variable
						// with Interpolant type, and b) if we have a struct or array, handling all the members and
						// elements could get unwieldy fast.
						added_arg_ids.insert(stage_in_var_id);
						break;
					}

					case GLSLstd450Modf:
					case GLSLstd450Frexp:
					{
						uint32_t base_id = ops[5];
						if (global_var_ids.find(base_id) != global_var_ids.end())
							added_arg_ids.insert(base_id);
						break;
					}

					default:
						break;
					}
				}
				break;
			}

			case OpGroupNonUniformInverseBallot:
			{
				added_arg_ids.insert(builtin_subgroup_invocation_id_id);
				break;
			}

			case OpGroupNonUniformBallotFindLSB:
			case OpGroupNonUniformBallotFindMSB:
			{
				added_arg_ids.insert(builtin_subgroup_size_id);
				break;
			}

			case OpGroupNonUniformBallotBitCount:
			{
				auto operation = static_cast<GroupOperation>(ops[3]);
				switch (operation)
				{
				case GroupOperationReduce:
					added_arg_ids.insert(builtin_subgroup_size_id);
					break;
				case GroupOperationInclusiveScan:
				case GroupOperationExclusiveScan:
					added_arg_ids.insert(builtin_subgroup_invocation_id_id);
					break;
				default:
					break;
				}
				break;
			}

			case OpDemoteToHelperInvocation:
				if (needs_manual_helper_invocation_updates() && needs_helper_invocation)
					added_arg_ids.insert(builtin_helper_invocation_id);
				break;

			case OpIsHelperInvocationEXT:
				if (needs_manual_helper_invocation_updates())
					added_arg_ids.insert(builtin_helper_invocation_id);
				break;

			case OpRayQueryInitializeKHR:
			case OpRayQueryProceedKHR:
			case OpRayQueryTerminateKHR:
			case OpRayQueryGenerateIntersectionKHR:
			case OpRayQueryConfirmIntersectionKHR:
			{
				// Ray query accesses memory directly, need check pass down object if using Private storage class.
				uint32_t base_id = ops[0];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				break;
			}

			case OpRayQueryGetRayTMinKHR:
			case OpRayQueryGetRayFlagsKHR:
			case OpRayQueryGetWorldRayOriginKHR:
			case OpRayQueryGetWorldRayDirectionKHR:
			case OpRayQueryGetIntersectionCandidateAABBOpaqueKHR:
			case OpRayQueryGetIntersectionTypeKHR:
			case OpRayQueryGetIntersectionTKHR:
			case OpRayQueryGetIntersectionInstanceCustomIndexKHR:
			case OpRayQueryGetIntersectionInstanceIdKHR:
			case OpRayQueryGetIntersectionInstanceShaderBindingTableRecordOffsetKHR:
			case OpRayQueryGetIntersectionGeometryIndexKHR:
			case OpRayQueryGetIntersectionPrimitiveIndexKHR:
			case OpRayQueryGetIntersectionBarycentricsKHR:
			case OpRayQueryGetIntersectionFrontFaceKHR:
			case OpRayQueryGetIntersectionObjectRayDirectionKHR:
			case OpRayQueryGetIntersectionObjectRayOriginKHR:
			case OpRayQueryGetIntersectionObjectToWorldKHR:
			case OpRayQueryGetIntersectionWorldToObjectKHR:
			{
				// Ray query accesses memory directly, need check pass down object if using Private storage class.
				uint32_t base_id = ops[2];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				break;
			}

			default:
				break;
			}

			if (needs_manual_helper_invocation_updates() && b.terminator == SPIRBlock::Kill &&
			    needs_helper_invocation)
				added_arg_ids.insert(builtin_helper_invocation_id);

			// TODO: Add all other operations which can affect memory.
			// We should consider a more unified system here to reduce boiler-plate.
			// This kind of analysis is done in several places ...
		}
	}

	function_global_vars[func_id] = added_arg_ids;

	// Add the global variables as arguments to the function
	if (func_id != ir.default_entry_point)
	{
		bool control_point_added_in = false;
		bool control_point_added_out = false;
		bool patch_added_in = false;
		bool patch_added_out = false;

		for (uint32_t arg_id : added_arg_ids)
		{
			auto &var = get<SPIRVariable>(arg_id);
			uint32_t type_id = var.basetype;
			auto *p_type = &get<SPIRType>(type_id);
			BuiltIn bi_type = BuiltIn(get_decoration(arg_id, DecorationBuiltIn));

			bool is_patch = has_decoration(arg_id, DecorationPatch) || is_patch_block(*p_type);
			bool is_block = has_decoration(p_type->self, DecorationBlock);
			bool is_control_point_storage =
			    !is_patch && ((is_tessellation_shader() && var.storage == StorageClassInput) ||
			                  (is_tesc_shader() && var.storage == StorageClassOutput));
			bool is_patch_block_storage = is_patch && is_block && var.storage == StorageClassOutput;
			bool is_builtin = is_builtin_variable(var);
			bool variable_is_stage_io =
					!is_builtin || bi_type == BuiltInPosition || bi_type == BuiltInPointSize ||
					bi_type == BuiltInClipDistance || bi_type == BuiltInCullDistance ||
					p_type->basetype == SPIRType::Struct;
			bool is_redirected_to_global_stage_io = (is_control_point_storage || is_patch_block_storage) &&
			                                        variable_is_stage_io;

			// If output is masked it is not considered part of the global stage IO interface.
			if (is_redirected_to_global_stage_io && var.storage == StorageClassOutput)
				is_redirected_to_global_stage_io = !is_stage_output_variable_masked(var);

			if (is_redirected_to_global_stage_io)
			{
				// Tessellation control shaders see inputs and per-point outputs as arrays.
				// Similarly, tessellation evaluation shaders see per-point inputs as arrays.
				// We collected them into a structure; we must pass the array of this
				// structure to the function.
				std::string name;
				if (is_patch)
					name = var.storage == StorageClassInput ? patch_stage_in_var_name : patch_stage_out_var_name;
				else
					name = var.storage == StorageClassInput ? "gl_in" : "gl_out";

				if (var.storage == StorageClassOutput && has_decoration(p_type->self, DecorationBlock))
				{
					// If we're redirecting a block, we might still need to access the original block
					// variable if we're masking some members.
					for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(p_type->member_types.size()); mbr_idx++)
					{
						if (is_stage_output_block_member_masked(var, mbr_idx, true))
						{
							func.add_parameter(var.basetype, var.self, true);
							break;
						}
					}
				}

				if (var.storage == StorageClassInput)
				{
					auto &added_in = is_patch ? patch_added_in : control_point_added_in;
					if (added_in)
						continue;
					arg_id = is_patch ? patch_stage_in_var_id : stage_in_ptr_var_id;
					added_in = true;
				}
				else if (var.storage == StorageClassOutput)
				{
					auto &added_out = is_patch ? patch_added_out : control_point_added_out;
					if (added_out)
						continue;
					arg_id = is_patch ? patch_stage_out_var_id : stage_out_ptr_var_id;
					added_out = true;
				}

				type_id = get<SPIRVariable>(arg_id).basetype;
				uint32_t next_id = ir.increase_bound_by(1);
				func.add_parameter(type_id, next_id, true);
				set<SPIRVariable>(next_id, type_id, StorageClassFunction, 0, arg_id);

				set_name(next_id, name);
				if (is_tese_shader() && msl_options.raw_buffer_tese_input && var.storage == StorageClassInput)
					set_decoration(next_id, DecorationNonWritable);
			}
			else if (is_builtin && has_decoration(p_type->self, DecorationBlock))
			{
				// Get the pointee type
				type_id = get_pointee_type_id(type_id);
				p_type = &get<SPIRType>(type_id);

				uint32_t mbr_idx = 0;
				for (auto &mbr_type_id : p_type->member_types)
				{
					BuiltIn builtin = BuiltInMax;
					is_builtin = is_member_builtin(*p_type, mbr_idx, &builtin);
					if (is_builtin && has_active_builtin(builtin, var.storage))
					{
						// Add a arg variable with the same type and decorations as the member
						uint32_t next_ids = ir.increase_bound_by(2);
						uint32_t ptr_type_id = next_ids + 0;
						uint32_t var_id = next_ids + 1;

						// Make sure we have an actual pointer type,
						// so that we will get the appropriate address space when declaring these builtins.
						auto &ptr = set<SPIRType>(ptr_type_id, get<SPIRType>(mbr_type_id));
						ptr.self = mbr_type_id;
						ptr.storage = var.storage;
						ptr.pointer = true;
						ptr.pointer_depth++;
						ptr.parent_type = mbr_type_id;

						func.add_parameter(mbr_type_id, var_id, true);
						set<SPIRVariable>(var_id, ptr_type_id, StorageClassFunction);
						ir.meta[var_id].decoration = ir.meta[type_id].members[mbr_idx];
					}
					mbr_idx++;
				}
			}
			else
			{
				uint32_t next_id = ir.increase_bound_by(1);
				func.add_parameter(type_id, next_id, true);
				set<SPIRVariable>(next_id, type_id, StorageClassFunction, 0, arg_id);

				// Ensure the new variable has all the same meta info
				ir.meta[next_id] = ir.meta[arg_id];
			}
		}
	}
}